

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceInfo.cpp
# Opt level: O3

GMM_SURFACESTATE_FORMAT
GmmGetSurfaceStateFormat(GMM_RESOURCE_FORMAT Format,GMM_LIB_CONTEXT *pGmmLibContext)

{
  GMM_SURFACESTATE_FORMAT GVar1;
  
  GVar1 = GMM_SURFACESTATE_FORMAT_INVALID;
  if (Format - GMM_FORMAT_A1B5G5R5_UNORM < 0x180) {
    GVar1 = (pGmmLibContext->pPlatformInfo->Data).FormatTable[Format].SurfaceStateFormat;
  }
  return GVar1;
}

Assistant:

GMM_SURFACESTATE_FORMAT GMM_STDCALL GmmGetSurfaceStateFormat(GMM_RESOURCE_FORMAT Format, GMM_LIB_CONTEXT *pGmmLibContext)
{
    return ((Format > GMM_FORMAT_INVALID) &&
            (Format < GMM_RESOURCE_FORMATS)) ?
           pGmmLibContext->GetPlatformInfo().FormatTable[Format].SurfaceStateFormat :
           GMM_SURFACESTATE_FORMAT_INVALID;
}